

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.c
# Opt level: O1

int size_lookup(char *name)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *bstr;
  int iVar4;
  long lVar5;
  
  bstr = "tiny";
  lVar5 = 0;
  while( true ) {
    cVar1 = *name;
    iVar3 = cVar1 + 0x20;
    if (0x19 < (byte)(cVar1 + 0xbfU)) {
      iVar3 = (int)cVar1;
    }
    cVar1 = *bstr;
    iVar4 = cVar1 + 0x20;
    if (0x19 < (byte)(cVar1 + 0xbfU)) {
      iVar4 = (int)cVar1;
    }
    if ((iVar3 == iVar4) && (bVar2 = str_prefix(name,bstr), !bVar2)) break;
    bstr = size_table[lVar5 + 1].name;
    lVar5 = lVar5 + 1;
    if (bstr == (char *)0x0) {
      return -1;
    }
  }
  return (int)lVar5;
}

Assistant:

int size_lookup(const char *name)
{
	int size;

	for (size = 0; size_table[size].name != nullptr; size++)
	{
		if (LOWER(name[0]) == LOWER(size_table[size].name[0]) && !str_prefix(name, size_table[size].name))
			return size;
	}

	return -1;
}